

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                    *handler)

{
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  *this;
  wchar_t *s;
  bool bVar1;
  type count;
  bool local_4b;
  basic_string_view<wchar_t> local_48;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  *local_38;
  wchar_t *it;
  uint index;
  wchar_t c;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  *handler_local;
  wchar_t *end_local;
  wchar_t *begin_local;
  
  _index = handler;
  handler_local =
       (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
        *)end;
  end_local = begin;
  if (begin != end) {
    it._4_4_ = *begin;
    if ((it._4_4_ == L'}') || (it._4_4_ == L':')) {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
      ::operator()(handler);
      begin_local = end_local;
    }
    else if ((it._4_4_ < L'0') || (L'9' < it._4_4_)) {
      bVar1 = is_name_start<wchar_t>(it._4_4_);
      if (bVar1) {
        local_38 = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                    *)end_local;
        do {
          local_38 = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                      *)((long)&local_38->handler + 4);
          local_4b = false;
          if (local_38 != handler_local) {
            it._4_4_ = *(wchar_t *)&local_38->handler;
            bVar1 = is_name_start<wchar_t>(it._4_4_);
            local_4b = true;
            if (!bVar1) {
              local_4b = L'/' < it._4_4_ && it._4_4_ < L':';
            }
          }
          s = end_local;
          this = _index;
        } while (local_4b);
        count = to_unsigned<long>((long)local_38 - (long)end_local >> 2);
        basic_string_view<wchar_t>::basic_string_view(&local_48,s,count);
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
        ::operator()(this,local_48);
        begin_local = (wchar_t *)local_38;
      }
      else {
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
        ::on_error(_index,"invalid format string");
        begin_local = end_local;
      }
    }
    else {
      it._0_4_ = parse_nonnegative_int<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>&>
                           (&end_local,end,handler);
      if (((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
            *)end_local == handler_local) || ((*end_local != L'}' && (*end_local != L':')))) {
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
        ::on_error(_index,"invalid format string");
        begin_local = end_local;
      }
      else {
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
        ::operator()(_index,(uint)it);
        begin_local = end_local;
      }
    }
    return begin_local;
  }
  __assert_fail("begin != end",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x6fc,
                "const Char *fmt::internal::parse_arg_id(const Char *, const Char *, IDHandler &&) [Char = wchar_t, IDHandler = fmt::internal::width_adapter<fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<wchar_t>>, wchar_t>>> &, wchar_t>]"
               );
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}